

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void TestLogging(bool check_counts)

{
  int iVar1;
  _Setw _Var2;
  ostream *poVar3;
  int *piVar4;
  void *this;
  int64 iVar5;
  SendMethod in_R9;
  CheckOpString local_2b8;
  LogMessage local_2b0;
  long local_2a0;
  long local_298;
  string *local_290;
  _Check_string *_result_2;
  LogMessage local_280;
  long local_270;
  long local_268;
  string *local_260;
  _Check_string *_result_1;
  LogMessage local_250;
  long local_240;
  long local_238;
  string *local_230;
  _Check_string *_result;
  LogMessage local_218;
  undefined1 local_208 [8];
  LogMessage outer;
  allocator<char> local_1e9;
  string local_1e8 [32];
  LogMessage local_1c8;
  int local_1b4;
  undefined1 local_1b0 [4];
  int j;
  char local_1a0 [8];
  char const_s [12];
  char local_180 [8];
  char s [6];
  LogMessageVoidify local_165;
  PRIVATE_Counter local_164;
  code *local_160;
  undefined8 uStack_158;
  LogMessage local_150;
  PRIVATE_Counter local_13c;
  code *local_138;
  undefined8 uStack_130;
  LogMessage local_128;
  PRIVATE_Counter local_114;
  code *local_110;
  undefined8 uStack_108;
  LogMessage local_100;
  PRIVATE_Counter local_ec;
  code *local_e8;
  undefined8 uStack_e0;
  LogMessage local_d8;
  PRIVATE_Counter local_c4;
  code *local_c0;
  undefined8 uStack_b8;
  LogMessage local_b0;
  PRIVATE_Counter local_9c;
  code *local_98;
  undefined8 uStack_90;
  LogMessage local_88;
  int local_74;
  int local_70;
  int old_errno;
  int i;
  LogMessage local_38;
  int64 local_28;
  int64 base_num_errors;
  int64 base_num_warning;
  int64 base_num_infos;
  bool check_counts_local;
  
  base_num_infos._7_1_ = check_counts;
  base_num_warning = google::LogMessage::num_messages(0);
  base_num_errors = google::LogMessage::num_messages(1);
  local_28 = google::LogMessage::num_messages(2);
  google::LogMessage::LogMessage
            (&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0xf7);
  poVar3 = google::LogMessage::stream(&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"foo ",(allocator<char> *)((long)&old_errno + 3));
  poVar3 = std::operator<<(poVar3,(string *)&i);
  poVar3 = std::operator<<(poVar3,"bar ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,10);
  poVar3 = std::operator<<(poVar3,' ');
  std::ostream::operator<<(poVar3,3.4);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&old_errno + 3));
  google::LogMessage::~LogMessage(&local_38);
  for (local_70 = 0; local_70 < 10; local_70 = local_70 + 1) {
    piVar4 = __errno_location();
    iVar1 = local_70;
    local_74 = *piVar4;
    piVar4 = __errno_location();
    *piVar4 = iVar1;
    TestLogging::occurrences_251 = TestLogging::occurrences_251 + 1;
    iVar1 = TestLogging::occurrences_mod_n_251 + 1;
    if (2 < TestLogging::occurrences_mod_n_251 + 1) {
      iVar1 = TestLogging::occurrences_mod_n_251 + -1;
    }
    TestLogging::occurrences_mod_n_251 = iVar1;
    if (TestLogging::occurrences_mod_n_251 == 1) {
      local_98 = google::LogMessage::SendToLog;
      uStack_90 = 0;
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0xfb,2,TestLogging::occurrences_251,in_R9);
      poVar3 = google::LogMessage::stream(&local_88);
      poVar3 = std::operator<<(poVar3,"Plog every 2, iteration ");
      local_9c = COUNTER;
      google::operator<<(poVar3,&local_9c);
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_88);
    }
    iVar1 = local_74;
    piVar4 = __errno_location();
    *piVar4 = iVar1;
    TestLogging::occurrences_254 = TestLogging::occurrences_254 + 1;
    iVar1 = TestLogging::occurrences_mod_n_254 + 1;
    if (3 < TestLogging::occurrences_mod_n_254 + 1) {
      iVar1 = TestLogging::occurrences_mod_n_254 + -2;
    }
    TestLogging::occurrences_mod_n_254 = iVar1;
    if (TestLogging::occurrences_mod_n_254 == 1) {
      local_c0 = google::LogMessage::SendToLog;
      uStack_b8 = 0;
      google::LogMessage::LogMessage
                (&local_b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0xfe,2,TestLogging::occurrences_254,in_R9);
      poVar3 = google::LogMessage::stream(&local_b0);
      poVar3 = std::operator<<(poVar3,"Log every 3, iteration ");
      local_c4 = COUNTER;
      poVar3 = google::operator<<(poVar3,&local_c4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      google::LogMessage::~LogMessage(&local_b0);
    }
    TestLogging::occurrences_255 = TestLogging::occurrences_255 + 1;
    iVar1 = TestLogging::occurrences_mod_n_255 + 1;
    if (4 < TestLogging::occurrences_mod_n_255 + 1) {
      iVar1 = TestLogging::occurrences_mod_n_255 + -3;
    }
    TestLogging::occurrences_mod_n_255 = iVar1;
    if (TestLogging::occurrences_mod_n_255 == 1) {
      local_e8 = google::LogMessage::SendToLog;
      uStack_e0 = 0;
      google::LogMessage::LogMessage
                (&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0xff,2,TestLogging::occurrences_255,in_R9);
      poVar3 = google::LogMessage::stream(&local_d8);
      poVar3 = std::operator<<(poVar3,"Log every 4, iteration ");
      local_ec = COUNTER;
      poVar3 = google::operator<<(poVar3,&local_ec);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      google::LogMessage::~LogMessage(&local_d8);
    }
    TestLogging::occurrences_257 = TestLogging::occurrences_257 + 1;
    TestLogging::occurrences_mod_n_257 = (TestLogging::occurrences_mod_n_257 + 1) % 5;
    if (TestLogging::occurrences_mod_n_257 == 1) {
      local_110 = google::LogMessage::SendToLog;
      uStack_108 = 0;
      google::LogMessage::LogMessage
                (&local_100,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x101,1,TestLogging::occurrences_257,in_R9);
      poVar3 = google::LogMessage::stream(&local_100);
      poVar3 = std::operator<<(poVar3,"Log if every 5, iteration ");
      local_114 = COUNTER;
      google::operator<<(poVar3,&local_114);
      google::LogMessage::~LogMessage(&local_100);
    }
    TestLogging::occurrences_258 = TestLogging::occurrences_258 + 1;
    TestLogging::occurrences_260 = TestLogging::occurrences_260 + 1;
    TestLogging::occurrences_mod_n_260 = (TestLogging::occurrences_mod_n_260 + 1) % 1;
    if (TestLogging::occurrences_mod_n_260 == 0) {
      local_138 = google::LogMessage::SendToLog;
      uStack_130 = 0;
      google::LogMessage::LogMessage
                (&local_128,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x104,0,TestLogging::occurrences_260,in_R9);
      poVar3 = google::LogMessage::stream(&local_128);
      poVar3 = std::operator<<(poVar3,"Log if every 1, iteration ");
      local_13c = COUNTER;
      google::operator<<(poVar3,&local_13c);
      google::LogMessage::~LogMessage(&local_128);
    }
    TestLogging::occurrences_261 = TestLogging::occurrences_261 + 1;
    if ((local_70 < 3) &&
       (TestLogging::occurrences_mod_n_261 = (TestLogging::occurrences_mod_n_261 + 1) % 2,
       TestLogging::occurrences_mod_n_261 == 1)) {
      local_160 = google::LogMessage::SendToLog;
      uStack_158 = 0;
      google::LogMessage::LogMessage
                (&local_150,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x105,2,TestLogging::occurrences_261,in_R9);
      poVar3 = google::LogMessage::stream(&local_150);
      poVar3 = std::operator<<(poVar3,"Log if less than 3 every 2, iteration ");
      local_164 = COUNTER;
      google::operator<<(poVar3,&local_164);
      google::LogMessage::~LogMessage(&local_150);
    }
  }
  google::LogMessageVoidify::LogMessageVoidify(&local_165);
  google::LogMessage::LogMessage
            ((LogMessage *)s,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x108,1);
  poVar3 = google::LogMessage::stream((LogMessage *)s);
  poVar3 = std::operator<<(poVar3,"log_if this");
  google::LogMessageVoidify::operator&(&local_165,poVar3);
  google::LogMessage::~LogMessage((LogMessage *)s);
  builtin_strncpy(local_180,"array",6);
  google::LogMessage::LogMessage
            ((LogMessage *)(const_s + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x10c);
  poVar3 = google::LogMessage::stream((LogMessage *)(const_s + 8));
  std::operator<<(poVar3,local_180);
  google::LogMessage::~LogMessage((LogMessage *)(const_s + 8));
  builtin_strncpy(local_1a0,"const ar",8);
  builtin_strncpy(const_s,"ray",4);
  google::LogMessage::LogMessage
            ((LogMessage *)local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x10e);
  poVar3 = google::LogMessage::stream((LogMessage *)local_1b0);
  std::operator<<(poVar3,local_1a0);
  google::LogMessage::~LogMessage((LogMessage *)local_1b0);
  local_1b4 = 1000;
  google::LogMessage::LogMessage
            (&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x110,2);
  poVar3 = google::LogMessage::stream(&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"foo",&local_1e9);
  poVar3 = std::operator<<(poVar3,local_1e8);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b4);
  poVar3 = std::operator<<(poVar3,' ');
  _Var2 = std::setw(10);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b4);
  poVar3 = std::operator<<(poVar3," ");
  outer.data_._4_4_ = std::setw(1);
  poVar3 = std::operator<<(poVar3,outer.data_._4_4_);
  this = (void *)std::ostream::operator<<(poVar3,std::hex);
  std::ostream::operator<<(this,local_1b4);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  google::LogMessage::~LogMessage(&local_1c8);
  google::LogMessage::LogMessage
            ((LogMessage *)local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x114,2);
  poVar3 = google::LogMessage::stream((LogMessage *)local_208);
  std::operator<<(poVar3,"outer");
  google::LogMessage::LogMessage
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x117,2);
  poVar3 = google::LogMessage::stream(&local_218);
  std::operator<<(poVar3,"inner");
  google::LogMessage::~LogMessage(&local_218);
  google::LogMessage::~LogMessage((LogMessage *)local_208);
  google::LogMessage::LogMessage((LogMessage *)&_result,"foo",-1,0);
  poVar3 = google::LogMessage::stream((LogMessage *)&_result);
  std::operator<<(poVar3,"no prefix");
  google::LogMessage::~LogMessage((LogMessage *)&_result);
  if ((base_num_infos._7_1_ & 1) != 0) {
    local_238 = google::GetReferenceableValue(base_num_warning + 0xe);
    iVar5 = google::LogMessage::num_messages(0);
    local_240 = google::GetReferenceableValue(iVar5);
    local_230 = google::Check_EQImpl<long,long>
                          (&local_238,&local_240,
                           "base_num_infos + 14 == LogMessage::num_messages(GLOG_INFO)");
    if (local_230 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_1,local_230);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_250,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x11d,(CheckOpString *)&_result_1);
      google::LogMessage::stream(&local_250);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_250);
    }
    local_268 = google::GetReferenceableValue(base_num_errors + 3);
    iVar5 = google::LogMessage::num_messages(1);
    local_270 = google::GetReferenceableValue(iVar5);
    local_260 = google::Check_EQImpl<long,long>
                          (&local_268,&local_270,
                           "base_num_warning + 3 == LogMessage::num_messages(GLOG_WARNING)");
    if (local_260 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_2,local_260);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_280,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x11e,(CheckOpString *)&_result_2);
      google::LogMessage::stream(&local_280);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_280);
    }
    local_298 = google::GetReferenceableValue(local_28 + 0x11);
    iVar5 = google::LogMessage::num_messages(2);
    local_2a0 = google::GetReferenceableValue(iVar5);
    local_290 = google::Check_EQImpl<long,long>
                          (&local_298,&local_2a0,
                           "base_num_errors + 17 == LogMessage::num_messages(GLOG_ERROR)");
    if (local_290 != (string *)0x0) {
      google::CheckOpString::CheckOpString(&local_2b8,local_290);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_2b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x11f,&local_2b8);
      google::LogMessage::stream(&local_2b0);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
    }
  }
  return;
}

Assistant:

void TestLogging(bool check_counts) {
  int64 base_num_infos   = LogMessage::num_messages(GLOG_INFO);
  int64 base_num_warning = LogMessage::num_messages(GLOG_WARNING);
  int64 base_num_errors  = LogMessage::num_messages(GLOG_ERROR);

  LOG(INFO) << string("foo ") << "bar " << 10 << ' ' << 3.4;
  for ( int i = 0; i < 10; ++i ) {
    int old_errno = errno;
    errno = i;
    PLOG_EVERY_N(ERROR, 2) << "Plog every 2, iteration " << COUNTER;
    errno = old_errno;

    LOG_EVERY_N(ERROR, 3) << "Log every 3, iteration " << COUNTER << endl;
    LOG_EVERY_N(ERROR, 4) << "Log every 4, iteration " << COUNTER << endl;

    LOG_IF_EVERY_N(WARNING, true, 5) << "Log if every 5, iteration " << COUNTER;
    LOG_IF_EVERY_N(WARNING, false, 3)
        << "Log if every 3, iteration " << COUNTER;
    LOG_IF_EVERY_N(INFO, true, 1) << "Log if every 1, iteration " << COUNTER;
    LOG_IF_EVERY_N(ERROR, (i < 3), 2)
        << "Log if less than 3 every 2, iteration " << COUNTER;
  }
  LOG_IF(WARNING, true) << "log_if this";
  LOG_IF(WARNING, false) << "don't log_if this";

  char s[] = "array";
  LOG(INFO) << s;
  const char const_s[] = "const array";
  LOG(INFO) << const_s;
  int j = 1000;
  LOG(ERROR) << string("foo") << ' '<< j << ' ' << setw(10) << j << " "
             << setw(1) << hex << j;

  {
    google::LogMessage outer(__FILE__, __LINE__, GLOG_ERROR);
    outer.stream() << "outer";

    LOG(ERROR) << "inner";
  }

  LogMessage("foo", LogMessage::kNoLogPrefix, GLOG_INFO).stream() << "no prefix";

  if (check_counts) {
    CHECK_EQ(base_num_infos   + 14, LogMessage::num_messages(GLOG_INFO));
    CHECK_EQ(base_num_warning + 3,  LogMessage::num_messages(GLOG_WARNING));
    CHECK_EQ(base_num_errors  + 17, LogMessage::num_messages(GLOG_ERROR));
  }
}